

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.h
# Opt level: O1

void __thiscall CCommandManager::CCommandManager(CCommandManager *this)

{
  (this->m_aCommands).list = (CCommand *)0x0;
  array<CCommandManager::CCommand,_allocator_default<CCommandManager::CCommand>_>::clear
            (&this->m_aCommands);
  this->m_pConsole = (IConsole *)0x0;
  array<CCommandManager::CCommand,_allocator_default<CCommandManager::CCommand>_>::clear
            (&this->m_aCommands);
  return;
}

Assistant:

CCommandManager()
    {
        m_pConsole = 0;
        m_aCommands.clear();
    }